

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3443.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3443::ComputeInternalJacobianPreInt
          (ChElementShellANCF_3443 *this,ChMatrixRef *H,double Kfactor,double Rfactor)

{
  Matrix<double,__1,__1,_0,__1,__1> *a_rhs;
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  PointerType pdVar14;
  ulong uVar15;
  char *pcVar16;
  double *pdVar17;
  PointerType pdVar18;
  ulong uVar19;
  double *pdVar20;
  PointerType pdVar21;
  ulong uVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined8 in_XMM0_Qb;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow2;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow1;
  ChMatrixNM<double,_1,_NSF>_conflict3 tempRow0;
  Matrix3xN e_bar;
  Matrix3xN e_bar_dot;
  MatrixNxN K_K13Compact;
  ChMatrixNMc<double,_9,_NSF_*_NSF> K2;
  ChMatrixNMc<double,_9,_NSF_*_NSF> PI2;
  assign_op<double,_double> local_9d79;
  ChElementShellANCF_3443 *local_9d78;
  double local_9d70;
  undefined8 uStack_9d68;
  long local_9d58;
  plainobjectbase_evaluator_data<double,_16> local_9d50;
  Scalar local_9d48;
  undefined8 local_9d40;
  double *local_9d30;
  undefined8 local_9d28;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_9d20;
  undefined1 local_9d00 [64];
  undefined1 local_9cc0 [64];
  undefined1 local_9c80 [64];
  undefined1 local_9c40 [64];
  undefined1 local_9c00 [64];
  undefined1 local_9bc0 [64];
  undefined1 local_9b80 [128];
  undefined1 local_9b00 [64];
  undefined1 local_9ac0 [64];
  undefined1 local_9a80 [64];
  undefined1 local_9a40 [64];
  undefined1 local_9a00 [64];
  undefined1 local_99c0 [64];
  undefined1 local_9980 [64];
  undefined1 local_9940 [64];
  undefined1 local_9900 [64];
  undefined1 local_98c0 [64];
  Matrix<double,_9,_256,_0,_9,_256> *local_9880 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_9870;
  double adStack_9090 [2];
  Matrix<double,_9,_256,_0,_9,_256> local_9080;
  Matrix<double,_9,_256,_0,_9,_256> local_4880;
  
  local_9d78 = (ChElementShellANCF_3443 *)Rfactor;
  local_9d70 = Kfactor;
  uStack_9d68 = in_XMM0_Qb;
  CalcCoordMatrix(this,(Matrix3xN *)local_9b80);
  CalcCoordDerivMatrix(this,(Matrix3xN *)local_9a00);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = this->m_Alpha;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_9d78;
  auVar11._8_8_ = uStack_9d68;
  auVar11._0_8_ = local_9d70;
  pdVar13 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 2;
  pdVar20 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 8;
  lVar23 = 0;
  auVar28 = vfmadd213sd_fma(auVar39,auVar38,auVar11);
  local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [0] = this->m_Alpha * local_9d70;
  local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [1] = (double)local_9a00;
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [0] = auVar28._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.
       array[0];
  auVar29 = vbroadcastsd_avx512f(auVar28);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                 m_storage.m_data.array[0];
  auVar30 = vbroadcastsd_avx512f(auVar3);
  auVar31 = vmulpd_avx512f(auVar29,local_9a00);
  auVar32 = vmulpd_avx512f(auVar29,local_99c0);
  auVar33 = vmulpd_avx512f(auVar30,local_9b80._0_64_);
  auVar34 = vmulpd_avx512f(auVar30,local_9b80._64_64_);
  auVar35 = vmulpd_avx512f(auVar30,local_9b00);
  auVar36 = vmulpd_avx512f(auVar30,local_9ac0);
  auVar37 = vmulpd_avx512f(auVar30,local_9a80);
  auVar30 = vmulpd_avx512f(auVar30,local_9a40);
  pdVar17 = local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
            m_data.array + 5;
  local_9c00 = vaddpd_avx512f(auVar33,auVar31);
  local_9bc0 = vaddpd_avx512f(auVar34,auVar32);
  auVar31 = vmulpd_avx512f(auVar29,local_9980);
  local_9c80 = vaddpd_avx512f(auVar35,auVar31);
  auVar31 = vmulpd_avx512f(auVar29,local_9940);
  local_9c40 = vaddpd_avx512f(auVar36,auVar31);
  auVar31 = vmulpd_avx512f(auVar29,local_9900);
  auVar29 = vmulpd_avx512f(auVar29,local_98c0);
  local_9d00 = vaddpd_avx512f(auVar37,auVar31);
  local_9cc0 = vaddpd_avx512f(auVar30,auVar29);
  local_4880.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.m_data.array
  [1] = (double)local_9b80;
  do {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(local_9b80 + lVar23 * 8);
    auVar29 = vbroadcastsd_avx512f(auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *(ulong *)(local_9b00 + lVar23 * 8);
    auVar30 = vbroadcastsd_avx512f(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *(ulong *)(local_9a80 + lVar23 * 8);
    auVar31 = vbroadcastsd_avx512f(auVar6);
    lVar26 = 0;
    pdVar24 = (double *)&local_9080;
    do {
      auVar32 = *(undefined1 (*) [64])(local_9c00 + lVar26 * 8);
      lVar26 = lVar26 + 8;
      auVar33 = vmulpd_avx512f(auVar29,auVar32);
      auVar34 = vmulpd_avx512f(auVar30,auVar32);
      auVar32 = vmulpd_avx512f(auVar31,auVar32);
      vpermt2pd_avx512f(_DAT_009b4a00,auVar34);
      vpermt2pd_avx512f(_DAT_009b4a80,auVar34);
      vpermt2pd_avx512f(_DAT_009b4b00,auVar33);
      auVar33 = vpermt2pd_avx512f(_DAT_009b4a40,auVar32);
      auVar34 = vpermt2pd_avx512f(_DAT_009b4ac0,auVar32);
      auVar32 = vpermt2pd_avx512f(_DAT_009b4b40,auVar32);
      *(undefined1 (*) [64])(pdVar24 + 0x10) = auVar32;
      *(undefined1 (*) [64])(pdVar24 + 8) = auVar34;
      *(undefined1 (*) [64])pdVar24 = auVar33;
      pdVar24 = pdVar24 + 0x18;
    } while (lVar26 != 0x10);
    lVar26 = 0x10;
    pdVar24 = pdVar13;
    do {
      pdVar1 = (double *)((long)adStack_9090 + lVar26);
      dVar10 = *(double *)((long)adStack_9090 + lVar26 + 8);
      dVar2 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar26);
      lVar26 = lVar26 + 0x18;
      ((plain_array<double,_2304,_0,_64> *)(pdVar24 + -2))->array[0] = *pdVar1;
      pdVar24[-1] = dVar10;
      *pdVar24 = dVar2;
      pdVar24 = pdVar24 + 9;
    } while (lVar26 != 400);
    auVar29 = vbroadcastsd_avx512f(auVar29._0_16_);
    auVar30 = vbroadcastsd_avx512f(auVar30._0_16_);
    auVar31 = vbroadcastsd_avx512f(auVar31._0_16_);
    lVar26 = 0;
    pdVar24 = (double *)&local_9080;
    do {
      auVar32 = *(undefined1 (*) [64])(local_9c80 + lVar26 * 8);
      lVar26 = lVar26 + 8;
      auVar33 = vmulpd_avx512f(auVar29,auVar32);
      auVar34 = vmulpd_avx512f(auVar30,auVar32);
      auVar32 = vmulpd_avx512f(auVar31,auVar32);
      vpermt2pd_avx512f(_DAT_009b4a00,auVar34);
      vpermt2pd_avx512f(_DAT_009b4a80,auVar34);
      vpermt2pd_avx512f(_DAT_009b4b00,auVar33);
      auVar33 = vpermt2pd_avx512f(_DAT_009b4a40,auVar32);
      auVar34 = vpermt2pd_avx512f(_DAT_009b4ac0,auVar32);
      auVar32 = vpermt2pd_avx512f(_DAT_009b4b40,auVar32);
      *(undefined1 (*) [64])(pdVar24 + 0x10) = auVar32;
      *(undefined1 (*) [64])(pdVar24 + 8) = auVar34;
      *(undefined1 (*) [64])pdVar24 = auVar33;
      pdVar24 = pdVar24 + 0x18;
    } while (lVar26 != 0x10);
    lVar26 = 0x10;
    pdVar24 = pdVar17;
    do {
      pdVar1 = (double *)((long)adStack_9090 + lVar26);
      dVar10 = *(double *)((long)adStack_9090 + lVar26 + 8);
      dVar2 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar26);
      lVar26 = lVar26 + 0x18;
      pdVar24[-2] = *pdVar1;
      pdVar24[-1] = dVar10;
      *pdVar24 = dVar2;
      pdVar24 = pdVar24 + 9;
    } while (lVar26 != 400);
    lVar26 = 0;
    pdVar24 = (double *)&local_9080;
    do {
      auVar32 = *(undefined1 (*) [64])(local_9d00 + lVar26 * 8);
      lVar26 = lVar26 + 8;
      auVar33 = vmulpd_avx512f(auVar29,auVar32);
      auVar34 = vmulpd_avx512f(auVar30,auVar32);
      auVar32 = vmulpd_avx512f(auVar31,auVar32);
      vpermt2pd_avx512f(_DAT_009b4a00,auVar34);
      vpermt2pd_avx512f(_DAT_009b4a80,auVar34);
      vpermt2pd_avx512f(_DAT_009b4b00,auVar33);
      auVar33 = vpermt2pd_avx512f(_DAT_009b4a40,auVar32);
      auVar34 = vpermt2pd_avx512f(_DAT_009b4ac0,auVar32);
      auVar32 = vpermt2pd_avx512f(_DAT_009b4b40,auVar32);
      *(undefined1 (*) [64])(pdVar24 + 0x10) = auVar32;
      *(undefined1 (*) [64])(pdVar24 + 8) = auVar34;
      *(undefined1 (*) [64])pdVar24 = auVar33;
      pdVar24 = pdVar24 + 0x18;
    } while (lVar26 != 0x10);
    lVar26 = 0x10;
    pdVar24 = pdVar20;
    do {
      pdVar1 = (double *)((long)adStack_9090 + lVar26);
      dVar10 = *(double *)((long)adStack_9090 + lVar26 + 8);
      dVar2 = *(double *)
               ((long)local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.
                      m_storage.m_data.array + lVar26);
      lVar26 = lVar26 + 0x18;
      pdVar24[-2] = *pdVar1;
      pdVar24[-1] = dVar10;
      *pdVar24 = dVar2;
      pdVar24 = pdVar24 + 9;
    } while (lVar26 != 400);
    lVar23 = lVar23 + 1;
    pdVar13 = pdVar13 + 0x90;
    pdVar17 = pdVar17 + 0x90;
    pdVar20 = pdVar20 + 0x90;
  } while (lVar23 != 0x10);
  local_9880[0] = &local_4880;
  a_rhs = &this->m_O2;
  local_9870 = a_rhs;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
      != 0x100) {
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                  "Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 256, 0>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>, const Eigen::Matrix<double, 9, 256, 0>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                 );
  }
  local_9d78 = this;
  if ((this->m_O2).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x100) {
    lVar27 = 0;
    memset(&local_9080,0,0x4800);
    pdVar13 = (double *)local_9880;
    local_9d48 = 1.0;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,9,256,0,9,256>const>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,256,0,9,256>>
              (&local_9080,
               (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_9,_256,_0,_9,_256>_>
                *)pdVar13,a_rhs,&local_9d48);
    lVar23 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).m_stride.m_outer.m_value;
    pdVar14 = (H->
              super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
              .
              super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_data;
    lVar26 = (H->
             super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
             .
             super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_rows.m_value;
    pdVar20 = local_9080.super_PlainObjectBase<Eigen::Matrix<double,_9,_256,_0,_9,_256>_>.m_storage.
              m_data.array + 8;
    pdVar18 = pdVar14 + lVar23;
    pdVar21 = pdVar14 + lVar23 * 2;
    do {
      if (lVar26 < lVar27 * 3 + 3) {
LAB_007795fe:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                      "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 3, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
                     );
      }
      lVar25 = 2;
      pdVar17 = pdVar20;
      do {
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar25 + -2) goto LAB_007795fe;
        pdVar14[lVar25 + -2] = ((plain_array<double,_2304,_0,_64> *)(pdVar17 + -8))->array[0];
        pdVar18[lVar25 + -2] = pdVar17[-7];
        pdVar21[lVar25 + -2] = pdVar17[-6];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar25 + -1) goto LAB_007795fe;
        pdVar14[lVar25 + -1] = pdVar17[-5];
        pdVar18[lVar25 + -1] = pdVar17[-4];
        pdVar21[lVar25 + -1] = pdVar17[-3];
        if ((H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value <= lVar25) goto LAB_007795fe;
        pdVar14[lVar25] = pdVar17[-2];
        pdVar18[lVar25] = pdVar17[-1];
        dVar2 = *pdVar17;
        pdVar17 = pdVar17 + 0x90;
        pdVar21[lVar25] = dVar2;
        lVar25 = lVar25 + 3;
      } while (lVar25 != 0x32);
      lVar27 = lVar27 + 1;
      pdVar14 = pdVar14 + lVar23 * 3;
      pdVar18 = pdVar18 + lVar23 * 3;
      pdVar21 = pdVar21 + lVar23 * 3;
      pdVar20 = pdVar20 + 9;
    } while (lVar27 != 0x10);
    uVar22 = (local_9d78->m_K13Compact).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    uVar7 = (local_9d78->m_K13Compact).
            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    if ((long)(uVar22 | uVar7) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    if ((uVar7 == 0x10) && (uVar22 == 0x10)) {
      auVar12._8_8_ = uStack_9d68;
      auVar12._0_8_ = local_9d70;
      local_9d20.m_dst = (DstEvaluatorType *)&local_9d50;
      local_9d20.m_functor = &local_9d79;
      auVar9._8_8_ = 0x8000000000000000;
      auVar9._0_8_ = 0x8000000000000000;
      auVar28 = vxorpd_avx512vl(auVar12,auVar9);
      local_9d40 = auVar28._0_8_;
      local_9d30 = (local_9d78->m_K13Compact).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
      ;
      local_9d28 = 0x10;
      local_9d50.data = pdVar13;
      local_9d20.m_src = (SrcEvaluatorType *)&local_9d48;
      local_9d20.m_dstExpr = (DstXprType *)pdVar13;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_16,_16,_1,_16,_16>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_1>
      ::run(&local_9d20);
      local_9d78 = (ChElementShellANCF_3443 *)0x10;
      local_9d58 = 8;
      local_9d70 = 0.0;
      uVar22 = 0;
      do {
        lVar23 = (H->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).m_stride.m_outer.m_value;
        pdVar18 = (H->
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                  ).
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                  .
                  super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                  .m_data;
        uVar7 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value;
        uVar8 = (H->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value;
        uVar19 = 0;
        uVar15 = 2;
        do {
          if (0xf < (uVar19 | uVar22)) {
            pcVar16 = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, 16, 16, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, 16, 16, 1>, Level = 1]"
            ;
LAB_00779649:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,pcVar16);
          }
          if (((((long)uVar7 <= (long)(uVar22 * 3)) || ((long)uVar8 <= (long)(uVar15 - 2))) ||
              (*(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * (long)local_9d70 + -0x10) =
                    pdVar13[uVar19] +
                    *(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * (long)local_9d70 + -0x10),
              uVar7 <= uVar22 * 3 + 1)) ||
             (((uVar8 <= uVar15 - 1 ||
               (*(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * local_9d58 + -8) =
                     pdVar13[uVar19] +
                     *(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * local_9d58 + -8),
               uVar7 <= uVar22 * 3 + 2)) || (uVar8 <= uVar15)))) {
            pcVar16 = 
            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
            ;
            goto LAB_00779649;
          }
          pdVar20 = pdVar13 + uVar19;
          uVar19 = uVar19 + 1;
          *(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * (long)local_9d78) =
               *pdVar20 + *(double *)((long)pdVar18 + uVar15 * 8 + lVar23 * (long)local_9d78);
          uVar15 = uVar15 + 3;
        } while (uVar15 != 0x32);
        uVar22 = uVar22 + 1;
        pdVar13 = pdVar13 + 0x10;
        local_9d78 = (ChElementShellANCF_3443 *)((long)local_9d78 + 0x18);
        local_9d58 = local_9d58 + 0x18;
        local_9d70 = (double)((long)local_9d70 + 0x18);
        if (uVar22 == 0x10) {
          return;
        }
      } while( true );
    }
    pcVar16 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 16, 16, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 16, 16, 1>]"
    ;
  }
  else {
    pcVar16 = 
    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 9, 256, 0>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 9, 256, 0>]"
    ;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,pcVar16);
}

Assistant:

void ChElementShellANCF_3443::ComputeInternalJacobianPreInt(ChMatrixRef& H, double Kfactor, double Rfactor) {
    // Calculate the Jacobian of the generalize internal force vector using the "Pre-Integration" style of method
    // assuming a linear viscoelastic material model (single term damping model).  For this style of method, the
    // components of the generalized internal force vector and its Jacobian that need to be integrated across the volume
    // are calculated once prior to the start of the simulation.  This makes this method well suited for applications
    // with many discrete layers since the in-simulation calculations are independent of the number of Gauss quadrature
    // points used throughout the entire element.  Since computationally expensive quantities are required for both the
    // generalized internal force vector and its Jacobian, these values were cached for reuse during this Jacobian
    // calculation.

    Matrix3xN e_bar;
    Matrix3xN e_bar_dot;

    CalcCoordMatrix(e_bar);
    CalcCoordDerivMatrix(e_bar_dot);

    // Build the [9 x NSF^2] matrix containing the combined scaled nodal coordinates and their time derivatives.
    Matrix3xN temp = (Kfactor + m_Alpha * Rfactor) * e_bar + (m_Alpha * Kfactor) * e_bar_dot;
    ChMatrixNM<double, 1, NSF> tempRow0 = temp.template block<1, NSF>(0, 0);
    ChMatrixNM<double, 1, NSF> tempRow1 = temp.template block<1, NSF>(1, 0);
    ChMatrixNM<double, 1, NSF> tempRow2 = temp.template block<1, NSF>(2, 0);
    ChMatrixNMc<double, 9, NSF * NSF> PI2;

    for (unsigned int v = 0; v < NSF; v++) {
        PI2.template block<3, NSF>(0, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow0;
        PI2.template block<3, NSF>(3, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow1;
        PI2.template block<3, NSF>(6, NSF * v) = e_bar.template block<3, 1>(0, v) * tempRow2;
    }

    // Calculate the matrix containing the dense part of the Jacobian matrix in a reordered form. This is then reordered
    // from its [9 x NSF^2] form into its required [3*NSF x 3*NSF] form
    ChMatrixNMc<double, 9, NSF* NSF> K2 = -PI2 * m_O2;

    for (unsigned int k = 0; k < NSF; k++) {
        for (unsigned int f = 0; f < NSF; f++) {
            H.block<3, 1>(3 * k, 3 * f) = K2.template block<3, 1>(0, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 1) = K2.template block<3, 1>(3, NSF * f + k);
            H.block<3, 1>(3 * k, 3 * f + 2) = K2.template block<3, 1>(6, NSF * f + k);
        }
    }

    // Add in the sparse (blocks times the 3x3 identity matrix) component of the Jacobian that was already calculated as
    // part of the generalized internal force calculations
    MatrixNxN K_K13Compact = -Kfactor * m_K13Compact;
    for (unsigned int i = 0; i < NSF; i++) {
        for (unsigned int j = 0; j < NSF; j++) {
            H(3 * i, 3 * j) += K_K13Compact(i, j);
            H(3 * i + 1, 3 * j + 1) += K_K13Compact(i, j);
            H(3 * i + 2, 3 * j + 2) += K_K13Compact(i, j);
        }
    }
}